

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_SVM_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007952a0 == '\x01') {
    DAT_007952a0 = '\0';
    (*(code *)*_LinearKernel_default_instance_)();
  }
  if (DAT_007952c8 == '\x01') {
    DAT_007952c8 = '\0';
    (*(code *)*_RBFKernel_default_instance_)();
  }
  if (DAT_007952f8 == '\x01') {
    DAT_007952f8 = '\0';
    (*(code *)*_PolyKernel_default_instance_)();
  }
  if (DAT_00795328 == '\x01') {
    DAT_00795328 = '\0';
    (*(code *)*_SigmoidKernel_default_instance_)();
  }
  if (DAT_00795350 == '\x01') {
    DAT_00795350 = '\0';
    (*(code *)*_Kernel_default_instance_)();
  }
  if (DAT_00795398 == '\x01') {
    DAT_00795398 = '\0';
    (*(code *)*_SparseNode_default_instance_)();
  }
  if (DAT_007953d0 == '\x01') {
    DAT_007953d0 = '\0';
    (*(code *)*_SparseVector_default_instance_)();
  }
  if (DAT_00795408 == '\x01') {
    DAT_00795408 = '\0';
    (*(code *)*_SparseSupportVectors_default_instance_)();
  }
  if (DAT_00795438 == '\x01') {
    DAT_00795438 = '\0';
    (*(code *)*_DenseVector_default_instance_)();
  }
  if (DAT_00795470 == '\x01') {
    DAT_00795470 = '\0';
    (*(code *)*_DenseSupportVectors_default_instance_)();
  }
  if (DAT_007954a0 == '\x01') {
    DAT_007954a0 = '\0';
    (*(code *)*_Coefficients_default_instance_)();
  }
  if (DAT_007954e0 == '\x01') {
    DAT_007954e0 = '\0';
    (*(code *)*_SupportVectorRegressor_default_instance_)();
  }
  if (DAT_007955a8 == '\x01') {
    DAT_007955a8 = 0;
    (*(code *)*_SupportVectorClassifier_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinearKernel_default_instance_.Shutdown();
  _RBFKernel_default_instance_.Shutdown();
  _PolyKernel_default_instance_.Shutdown();
  _SigmoidKernel_default_instance_.Shutdown();
  _Kernel_default_instance_.Shutdown();
  _SparseNode_default_instance_.Shutdown();
  _SparseVector_default_instance_.Shutdown();
  _SparseSupportVectors_default_instance_.Shutdown();
  _DenseVector_default_instance_.Shutdown();
  _DenseSupportVectors_default_instance_.Shutdown();
  _Coefficients_default_instance_.Shutdown();
  _SupportVectorRegressor_default_instance_.Shutdown();
  _SupportVectorClassifier_default_instance_.Shutdown();
}